

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epc18_2.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinEPC18_2>::eval_exc_vxc_polar_impl
               (double rho_a,double rho_b,double *eps,double *vrho_a,double *vrho_b)

{
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double in_XMM1_Qa;
  double t111;
  double t107;
  double t106;
  double t101;
  double t98;
  double t95;
  double t93;
  double t92;
  double t89;
  double t88;
  double t85;
  double t81;
  double t80;
  double t77;
  double t73;
  double t70;
  double t68;
  double t66;
  double t64;
  double t63;
  double t61;
  double t60;
  double t59;
  double t58;
  double t57;
  double t55;
  double t54;
  double t52;
  double t51;
  double t50;
  double t48;
  double t47;
  double t45;
  double t44;
  double t43;
  double t40;
  double t39;
  double t38;
  double t35;
  double t33;
  double t32;
  double t31;
  double t28;
  double t27;
  double t25;
  double t22;
  double t21;
  double t19;
  double t18;
  double t17;
  double t16;
  double t14;
  double t13;
  double t12;
  double t9;
  double t8;
  double t5;
  double t4;
  double t3;
  double t24;
  double t23;
  bool local_211;
  
  local_211 = in_XMM0_Qa <= 1e-24 && in_XMM1_Qa <= 1e-24;
  dVar1 = (double)local_211;
  dVar2 = in_XMM0_Qa + in_XMM1_Qa;
  dVar3 = 1.0 / dVar2;
  dVar4 = (double)(-(ulong)((in_XMM0_Qa + in_XMM0_Qa) * dVar3 <= 1e-15) & 0x3ff0000000000000);
  dVar5 = (double)(-(ulong)((in_XMM1_Qa + in_XMM1_Qa) * dVar3 <= 1e-15) & 0x3ff0000000000000);
  dVar6 = in_XMM0_Qa - in_XMM1_Qa;
  dVar7 = piecewise_functor_5<double>
                    (dVar4 != 0.0,-0.999999999999999,dVar5 != 0.0,0.999999999999999,dVar6 * dVar3);
  dVar8 = (dVar7 + 1.0) * dVar2;
  dVar9 = piecewise_functor_5<double>
                    (dVar5 != 0.0,-0.999999999999999,dVar4 != 0.0,0.999999999999999,-dVar6 * dVar3);
  dVar10 = dVar9 + 1.0;
  dVar11 = safe_math::cbrt<double>(1.21919097227307e-317);
  dVar12 = safe_math::cbrt<double>(1.21921567555536e-317);
  dVar13 = (dVar11 * 1.5874010519681996) / 2.0 + (dVar12 * 1.5874010519681996) / 2.0;
  dVar14 = dVar13 * dVar13;
  dVar15 = dVar14 * dVar14 * 0.06 * dVar14 + -(dVar14 * dVar13 * 0.5) + 3.9;
  dVar16 = 1.0 / dVar15;
  dVar17 = dVar10 * dVar16;
  dVar18 = 1.0 / (dVar2 * dVar2);
  dVar19 = dVar6 * dVar18;
  dVar20 = piecewise_functor_5<double>(dVar4 != 0.0,0.0,dVar5 != 0.0,0.0,dVar3 - dVar19);
  dVar21 = (dVar7 + 1.0) * dVar10 * dVar16;
  dVar18 = -dVar6 * dVar18;
  dVar6 = piecewise_functor_5<double>(dVar5 != 0.0,0.0,dVar4 != 0.0,0.0,-dVar3 - dVar18);
  dVar10 = dVar10 * (1.0 / (dVar15 * dVar15));
  dVar11 = 1.5874010519681996 / (dVar11 * dVar11);
  dVar12 = 1.5874010519681996 / (dVar12 * dVar12);
  dVar15 = (dVar11 * (dVar20 * dVar2 + 1.0 + dVar7)) / 6.0 +
           (dVar12 * (dVar6 * dVar2 + dVar9 + 1.0)) / 6.0;
  dVar13 = dVar14 * dVar14 * 0.06 * dVar13;
  dVar6 = piecewise_functor_3<double>
                    (dVar1 != 0.0,0.0,
                     (((-dVar8 * dVar6 * dVar16) / 4.0 +
                      (dVar8 * dVar10 * (dVar14 * 0.5 * -3.0 * dVar15 + dVar13 * 6.0 * dVar15)) /
                      4.0) - (dVar20 * dVar2 * dVar17) / 4.0) - dVar21 / 4.0);
  dVar15 = piecewise_functor_5<double>(dVar4 != 0.0,0.0,dVar5 != 0.0,0.0,-dVar3 - dVar19);
  dVar3 = piecewise_functor_5<double>(dVar5 != 0.0,0.0,dVar4 != 0.0,0.0,dVar3 - dVar18);
  dVar4 = (dVar11 * (dVar15 * dVar2 + 1.0 + dVar7)) / 6.0 +
          (dVar12 * (dVar3 * dVar2 + dVar9 + 1.0)) / 6.0;
  dVar3 = piecewise_functor_3<double>
                    (dVar1 != 0.0,0.0,
                     (((dVar8 * dVar10 * (dVar14 * 0.5 * -3.0 * dVar4 + dVar13 * 6.0 * dVar4)) / 4.0
                      - (dVar8 * dVar3 * dVar16) / 4.0) - (dVar15 * dVar2 * dVar17) / 4.0) -
                     dVar21 / 4.0);
  dVar1 = piecewise_functor_3<double>(dVar1 != 0.0,0.0,(-dVar8 * dVar17) / 4.0);
  *in_RDI = dVar1;
  *in_RSI = dVar2 * dVar6 + *in_RDI;
  *in_RDX = dVar2 * dVar3 + *in_RDI;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar_impl( double rho_a, double rho_b, double& eps, double& vrho_a, double& vrho_b ) {

    constexpr double t23 = constants::m_cbrt_2;
    constexpr double t24 = t23 * t23;


    const double t3 = rho_a <= dens_tol && rho_b <= dens_tol;
    const double t4 = rho_a + rho_b;
    const double t5 = 0.1e1 / t4;
    const double t8 = 0.2e1 * rho_a * t5 <= zeta_tol;
    const double t9 = zeta_tol - 0.1e1;
    const double t12 = 0.2e1 * rho_b * t5 <= zeta_tol;
    const double t13 = -t9;
    const double t14 = rho_a - rho_b;
    const double t16 = piecewise_functor_5( t8, t9, t12, t13, t14 * t5 );
    const double t17 = 0.1e1 + t16;
    const double t18 = t17 * t4;
    const double t19 = -t14;
    const double t21 = piecewise_functor_5( t12, t9, t8, t13, t19 * t5 );
    const double t22 = 0.1e1 + t21;
    const double t25 = safe_math::cbrt( t18 );
    const double t27 = t22 * t4;
    const double t28 = safe_math::cbrt( t27 );
    const double t31 = t24 * t25 / 0.2e1 + t24 * t28 / 0.2e1;
    const double t32 = t31 * t31;
    const double t33 = t32 * t31;
    const double t35 = t32 * t32;
    const double t38 = c * t35 * t32 - b * t33 + a;
    const double t39 = 0.1e1 / t38;
    const double t40 = t22 * t39;
    const double t43 = t4 * t4;
    const double t44 = 0.1e1 / t43;
    const double t45 = t14 * t44;
    const double t47 = piecewise_functor_5( t8, 0.0, t12, 0.0, t5 - t45 );
    const double t48 = t47 * t4;
    const double t50 = t17 * t22;
    const double t51 = t50 * t39;
    const double t52 = t19 * t44;
    const double t54 = piecewise_functor_5( t12, 0.0, t8, 0.0, -t5 - t52 );
    const double t55 = t54 * t39;
    const double t57 = t38 * t38;
    const double t58 = 0.1e1 / t57;
    const double t59 = t22 * t58;
    const double t60 = b * t32;
    const double t61 = t25 * t25;
    const double t63 = t24 / t61;
    const double t64 = t48 + 0.1e1 + t16;
    const double t66 = t28 * t28;
    const double t68 = t24 / t66;
    const double t70 = t54 * t4 + t21 + 0.1e1;
    const double t73 = t63 * t64 / 0.6e1 + t68 * t70 / 0.6e1;
    const double t77 = c * t35 * t31;
    const double t80 = -0.3e1 * t60 * t73 + 0.6e1 * t77 * t73;
    const double t81 = t59 * t80;
    const double t85 = piecewise_functor_3( t3, 0.0, -t18 * t55 / 0.4e1 + t18 * t81 / 0.4e1 - t48 * t40 / 0.4e1 - t51 / 0.4e1 );
    const double t88 = piecewise_functor_5( t8, 0.0, t12, 0.0, -t5 - t45 );
    const double t89 = t88 * t4;
    const double t92 = piecewise_functor_5( t12, 0.0, t8, 0.0, t5 - t52 );
    const double t93 = t92 * t39;
    const double t95 = t89 + 0.1e1 + t16;
    const double t98 = t92 * t4 + t21 + 0.1e1;
    const double t101 = t63 * t95 / 0.6e1 + t68 * t98 / 0.6e1;
    const double t106 = -0.3e1 * t60 * t101 + 0.6e1 * t77 * t101;
    const double t107 = t59 * t106;
    const double t111 = piecewise_functor_3( t3, 0.0, t18 * t107 / 0.4e1 - t18 * t93 / 0.4e1 - t89 * t40 / 0.4e1 - t51 / 0.4e1 );


    eps = piecewise_functor_3( t3, 0.0, -t18 * t40 / 0.4e1 );
    vrho_a = t4 * t85 + eps;
    vrho_b = t4 * t111 + eps;

  }